

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CalcStiffT<double>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZElementMatrixT<double> *ek,
          TPZElementMatrixT<double> *ef)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  ostream *poVar4;
  TPZManVector<TPZMaterialDataT<double>,_6> *this_00;
  int64_t iVar5;
  TPZCompElSide *pTVar6;
  TPZCompEl *pTVar7;
  int64_t iVar8;
  TPZMaterialDataT<double> *pTVar9;
  int *piVar10;
  TPZFMatrix<double> *this_01;
  undefined4 extraout_var;
  TPZIntPoints *pTVar11;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  TPZInterpolationSpace *msp_1;
  int i;
  int int_ind;
  REAL detJac;
  TPZFMatrix<double> jacInv;
  TPZFMatrix<double> axe;
  TPZFMatrix<double> jac;
  int intrulepoints;
  TPZManVector<int,_4> intorder;
  TPZGeoEl *ref;
  int order;
  int svec;
  TPZInterpolationSpace *msp;
  int64_t iref;
  TPZManVector<int,_4> ordervec;
  REAL weight;
  TPZManVector<double,_4> intpointtemp;
  TPZAutoPointer<TPZIntPoints> intrule;
  int dim;
  TPZManVector<TPZTransform<double>,_10> trvec;
  int64_t nref;
  TPZManVector<TPZMaterialDataT<double>,_6> datavec;
  TPZNullMaterialCS<double> *nullmat;
  TPZMatCombinedSpacesT<double> *matCombined;
  TPZMaterial *material;
  TPZVec<TPZMaterialDataT<double>_> *in_stack_fffffffffffcde98;
  undefined4 in_stack_fffffffffffcdea0;
  MType in_stack_fffffffffffcdea4;
  TPZCompMesh *in_stack_fffffffffffcdea8;
  TPZManVector<TPZMaterialDataT<double>,_6> *in_stack_fffffffffffcdeb0;
  TPZIntPoints *in_stack_fffffffffffcdeb8;
  undefined4 in_stack_fffffffffffcdec0;
  undefined4 in_stack_fffffffffffcdec4;
  int64_t in_stack_fffffffffffcdec8;
  TPZManVector<double,_4> *in_stack_fffffffffffcded0;
  long *plStack_320e0;
  TPZVec<TPZMaterialDataT<double>_> *size;
  int iStack_32090;
  MType MStack_3208c;
  double dStack_32088;
  TPZFMatrix<double> *in_stack_fffffffffffcdf98;
  REAL *in_stack_fffffffffffcdfa0;
  TPZFMatrix<double> *in_stack_fffffffffffcdfa8;
  TPZFMatrix<double> *in_stack_fffffffffffcdfb0;
  TPZVec<double> *in_stack_fffffffffffcdfb8;
  TPZGeoEl *in_stack_fffffffffffcdfc0;
  undefined1 auStack_31ec8 [48];
  TPZFMatrix<double> *pTStack_31e98;
  uint uStack_31e90;
  int iStack_31e8c;
  long *plStack_31e88;
  int64_t iStack_31e80;
  TPZVec<int> TStack_31e78;
  double adStack_31e48 [2];
  undefined1 auStack_31e38 [64];
  TPZAutoPointer<TPZIntPoints> TStack_31df8;
  undefined4 uStack_31dec;
  undefined1 auStack_31de8 [160];
  size_t in_stack_fffffffffffce2b8;
  char *in_stack_fffffffffffce2c0;
  TPZVec<TPZMaterialDataT<double>_> aTStack_30d70 [6251];
  
  lVar2 = (**(code **)(*in_RDI + 0xb8))();
  if ((lVar2 == 0) ||
     (plVar3 = (long *)__dynamic_cast(lVar2,&TPZMaterial::typeinfo,
                                      &TPZMatCombinedSpacesT<double>::typeinfo,0xfffffffffffffffe),
     plVar3 == (long *)0x0)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar4 = std::operator<<(poVar4,
                             "void TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CalcStiffT(TPZElementMatrixT<TVar> &, TPZElementMatrixT<TVar> &) [TGeometry = pzgeom::TPZGeoCube, TVar = double]"
                            );
    std::operator<<(poVar4," this->Material() == NULL\n");
    TPZElementMatrixT<double>::Reset
              ((TPZElementMatrixT<double> *)in_stack_fffffffffffcdeb0,in_stack_fffffffffffcdea8,
               in_stack_fffffffffffcdea4);
    TPZElementMatrixT<double>::Reset
              ((TPZElementMatrixT<double> *)in_stack_fffffffffffcdeb0,in_stack_fffffffffffcdea8,
               in_stack_fffffffffffcdea4);
  }
  else {
    if (lVar2 == 0) {
      this_00 = (TPZManVector<TPZMaterialDataT<double>,_6> *)0x0;
    }
    else {
      this_00 = (TPZManVector<TPZMaterialDataT<double>,_6> *)
                __dynamic_cast(lVar2,&TPZMaterial::typeinfo,&TPZNullMaterialCS<double>::typeinfo,0);
    }
    if (this_00 == (TPZManVector<TPZMaterialDataT<double>,_6> *)0x0) {
      (**(code **)(*in_RDI + 0xf8))(in_RDI,in_RSI,in_RDX);
      iVar1 = (**(code **)(*in_RDI + 0x90))();
      if (iVar1 != 0) {
        size = aTStack_30d70;
        TPZManVector<TPZMaterialDataT<double>,_6>::TPZManVector(this_00,(int64_t)size);
        iVar5 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0xf));
        TPZVec<TPZMaterialDataT<double>_>::resize
                  ((TPZVec<TPZMaterialDataT<double>_> *)
                   CONCAT44(in_stack_fffffffffffcdea4,in_stack_fffffffffffcdea0),
                   (int64_t)in_stack_fffffffffffcde98);
        (**(code **)(*in_RDI + 0x288))(in_RDI,aTStack_30d70,0);
        TPZManVector<TPZTransform<double>,_10>::TPZManVector
                  ((TPZManVector<TPZTransform<double>,_10> *)this_00,(int64_t)size);
        (**(code **)(*in_RDI + 0x280))(in_RDI,auStack_31de8);
        uStack_31dec = (**(code **)(*in_RDI + 0xb0))();
        TPZAutoPointer<TPZIntPoints>::TPZAutoPointer
                  ((TPZAutoPointer<TPZIntPoints> *)in_stack_fffffffffffcdeb0);
        adStack_31e48[1] = 0.0;
        TPZManVector<double,_4>::TPZManVector
                  (in_stack_fffffffffffcded0,in_stack_fffffffffffcdec8,
                   (double *)CONCAT44(in_stack_fffffffffffcdec4,in_stack_fffffffffffcdec0));
        adStack_31e48[0] = 0.0;
        TPZManVector<int,_4>::TPZManVector
                  ((TPZManVector<int,_4> *)
                   CONCAT44(in_stack_fffffffffffcdec4,in_stack_fffffffffffcdec0),
                   (int64_t)in_stack_fffffffffffcdeb8);
        for (iStack_31e80 = 0; iStack_31e80 < iVar5; iStack_31e80 = iStack_31e80 + 1) {
          pTVar6 = TPZVec<TPZCompElSide>::operator[]
                             ((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),iStack_31e80);
          pTVar7 = TPZCompElSide::Element(pTVar6);
          if (pTVar7 == (TPZCompEl *)0x0) {
            plStack_320e0 = (long *)0x0;
          }
          else {
            plStack_320e0 =
                 (long *)__dynamic_cast(pTVar7,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo
                                        ,0);
          }
          plStack_31e88 = plStack_320e0;
          if (plStack_320e0 != (long *)0x0) {
            TPZVec<int>::size(&TStack_31e78);
            TPZManVector<int,_4>::Resize
                      ((TPZManVector<int,_4> *)in_stack_fffffffffffcded0,in_stack_fffffffffffcdec8);
            iVar8 = TPZVec<int>::size(&TStack_31e78);
            iStack_31e8c = (int)iVar8;
            iVar1 = (**(code **)(*plStack_31e88 + 0x268))();
            pTVar9 = TPZVec<TPZMaterialDataT<double>_>::operator[](aTStack_30d70,iStack_31e80);
            (pTVar9->super_TPZMaterialData).p = iVar1;
            pTVar9 = TPZVec<TPZMaterialDataT<double>_>::operator[](aTStack_30d70,iStack_31e80);
            iVar1 = (pTVar9->super_TPZMaterialData).p;
            piVar10 = TPZVec<int>::operator[](&TStack_31e78,(long)(iStack_31e8c + -1));
            *piVar10 = iVar1;
          }
        }
        uStack_31e90 = (**(code **)(*plVar3 + 0x48))(plVar3,&TStack_31e78);
        this_01 = (TPZFMatrix<double> *)TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffcdea8)
        ;
        pTStack_31e98 = this_01;
        iVar1 = (*(this_01->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x1e])();
        iVar1 = (*(this_01->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0xe])(this_01,(ulong)(iVar1 - 1),(ulong)uStack_31e90);
        iVar5 = CONCAT44(extraout_var,iVar1);
        TPZAutoPointer<TPZIntPoints>::operator=
                  ((TPZAutoPointer<TPZIntPoints> *)
                   CONCAT44(in_stack_fffffffffffcdec4,in_stack_fffffffffffcdec0),
                   in_stack_fffffffffffcdeb8);
        TPZManVector<int,_4>::TPZManVector
                  ((TPZManVector<int,_4> *)this_01,iVar5,
                   (int *)CONCAT44(in_stack_fffffffffffcdec4,in_stack_fffffffffffcdec0));
        pTVar11 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_31df8);
        (*pTVar11->_vptr_TPZIntPoints[5])(pTVar11,auStack_31ec8,0);
        pTVar11 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_31df8);
        iVar1 = (*pTVar11->_vptr_TPZIntPoints[3])();
        if (1000 < iVar1) {
          pzinternal::DebugStopImpl(in_stack_fffffffffffce2c0,in_stack_fffffffffffce2b8);
        }
        TPZFMatrix<double>::TPZFMatrix(this_01);
        TPZFMatrix<double>::TPZFMatrix(this_01);
        TPZFMatrix<double>::TPZFMatrix(this_01);
        for (MStack_3208c = Unknown; (int)MStack_3208c < iVar1; MStack_3208c = MStack_3208c + EF) {
          pTVar11 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_31df8);
          (*pTVar11->_vptr_TPZIntPoints[4])(pTVar11,(ulong)MStack_3208c,auStack_31e38,adStack_31e48)
          ;
          TPZGeoEl::Jacobian(in_stack_fffffffffffcdfc0,in_stack_fffffffffffcdfb8,
                             in_stack_fffffffffffcdfb0,in_stack_fffffffffffcdfa8,
                             in_stack_fffffffffffcdfa0,in_stack_fffffffffffcdf98);
          adStack_31e48[0] = ABS(dStack_32088) * adStack_31e48[0];
          iStack_32090 = 0;
          while( true ) {
            lVar2 = (long)iStack_32090;
            iVar5 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0xf));
            if (iVar5 <= lVar2) break;
            pTVar6 = TPZVec<TPZCompElSide>::operator[]
                               ((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),(long)iStack_32090);
            in_stack_fffffffffffcdeb0 =
                 (TPZManVector<TPZMaterialDataT<double>,_6> *)TPZCompElSide::Element(pTVar6);
            if (in_stack_fffffffffffcdeb0 == (TPZManVector<TPZMaterialDataT<double>,_6> *)0x0) {
              lVar2 = 0;
            }
            else {
              lVar2 = __dynamic_cast(in_stack_fffffffffffcdeb0,&TPZCompEl::typeinfo,
                                     &TPZInterpolationSpace::typeinfo,0);
            }
            if (lVar2 != 0) {
              in_stack_fffffffffffcdea4 = MStack_3208c;
              pTVar9 = TPZVec<TPZMaterialDataT<double>_>::operator[]
                                 (aTStack_30d70,(long)iStack_32090);
              (pTVar9->super_TPZMaterialData).intLocPtIndex = in_stack_fffffffffffcdea4;
            }
            iStack_32090 = iStack_32090 + 1;
          }
          (**(code **)(*in_RDI + 0x2a8))(in_RDI,auStack_31e38,auStack_31de8,aTStack_30d70);
          (**(code **)(*plVar3 + 0x68))
                    (adStack_31e48[0],plVar3,aTStack_30d70,in_RSI + 0x1f0,in_RDX + 0x1f0);
        }
        CleanupMaterialData((TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *)
                            CONCAT44(in_stack_fffffffffffcdea4,in_stack_fffffffffffcdea0),
                            in_stack_fffffffffffcde98);
        TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b70694);
        TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b706a1);
        TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b706ae);
        TPZManVector<int,_4>::~TPZManVector
                  ((TPZManVector<int,_4> *)
                   CONCAT44(in_stack_fffffffffffcdea4,in_stack_fffffffffffcdea0));
        TPZManVector<int,_4>::~TPZManVector
                  ((TPZManVector<int,_4> *)
                   CONCAT44(in_stack_fffffffffffcdea4,in_stack_fffffffffffcdea0));
        TPZManVector<double,_4>::~TPZManVector
                  ((TPZManVector<double,_4> *)
                   CONCAT44(in_stack_fffffffffffcdea4,in_stack_fffffffffffcdea0));
        TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZIntPoints> *)
                   CONCAT44(in_stack_fffffffffffcdea4,in_stack_fffffffffffcdea0));
        TPZManVector<TPZTransform<double>,_10>::~TPZManVector
                  ((TPZManVector<TPZTransform<double>,_10> *)in_stack_fffffffffffcdeb0);
        TPZManVector<TPZMaterialDataT<double>,_6>::~TPZManVector(in_stack_fffffffffffcdeb0);
      }
    }
    else {
      TPZElementMatrixT<double>::Reset
                ((TPZElementMatrixT<double> *)in_stack_fffffffffffcdeb0,in_stack_fffffffffffcdea8,
                 in_stack_fffffffffffcdea4);
      TPZElementMatrixT<double>::Reset
                ((TPZElementMatrixT<double> *)in_stack_fffffffffffcdeb0,in_stack_fffffffffffcdea8,
                 in_stack_fffffffffffcdea4);
      *(undefined4 *)(in_RSI + 8) = 2;
      *(undefined4 *)(in_RDX + 8) = 1;
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CalcStiffT(TPZElementMatrixT<TVar> &ek, TPZElementMatrixT<TVar> &ef)
{
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        ek.Reset();
        ef.Reset();
        return;
    }
    
    auto *nullmat = dynamic_cast<TPZNullMaterialCS<TVar> *>(material);
    if(nullmat)
    {
        ek.Reset();
        ef.Reset();
        ek.fType = TPZElementMatrix::EK;
        ef.fType = TPZElementMatrix::EF;
        return;
    }
    InitializeElementMatrix(ek,ef);
    
    if (this->NConnects() == 0) return;//boundary discontinuous elements have this characteristic
    
    TPZManVector<TPZMaterialDataT<TVar>,6> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,4> intpointtemp(TGeometry::Dimension,0.);
    REAL weight = 0.;
    
    TPZManVector<int,4> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,4> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        for (int i = 0; i < fElementVec.size(); i++) {
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[i].Element());
            if (!msp) {
                continue;
            }
            datavec[i].intLocPtIndex = int_ind;
        }
        
        this->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Contribute(datavec,weight,ek.fMat,ef.fMat);
    }//loop over integration points
    
    CleanupMaterialData(datavec);
}